

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O1

BindInfo *
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileGetBindInfo
          (optional_ptr<duckdb::FunctionData,_true> bind_data_p)

{
  bool bVar1;
  MultiFileList *this;
  OpenFileInfo *__args;
  type bind_data_p_00;
  FunctionData *in_RSI;
  BindInfo *in_RDI;
  vector<duckdb::Value,_true> file_path;
  MultiFileListIterator __begin2;
  MultiFileListIterator __end2;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_128;
  MultiFileListIterationHelper local_110;
  optional_ptr<duckdb::FunctionData,_true> local_108;
  vector<duckdb::Value,_true> local_100;
  undefined1 local_e8 [16];
  MultiFileList local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  MultiFileListIterator local_a8;
  Value local_68;
  
  (in_RDI->options)._M_h._M_buckets = &(in_RDI->options)._M_h._M_single_bucket;
  (in_RDI->options)._M_h._M_bucket_count = 1;
  (in_RDI->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (in_RDI->options)._M_h._M_element_count = 0;
  (in_RDI->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (in_RDI->options)._M_h._M_rehash_policy._M_next_resize = 0;
  (in_RDI->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  in_RDI->type = EXTERNAL;
  (in_RDI->table).ptr = (TableCatalogEntry *)0x0;
  local_108.ptr = in_RSI;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&local_108);
  local_128.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = shared_ptr<duckdb::MultiFileList,_true>::operator->
                   ((shared_ptr<duckdb::MultiFileList,_true> *)(local_108.ptr + 5));
  local_110 = MultiFileList::Files(this);
  MultiFileListIterationHelper::begin((MultiFileListIterator *)local_e8,&local_110);
  MultiFileListIterationHelper::end(&local_a8,&local_110);
  while( true ) {
    bVar1 = MultiFileListIterationHelper::MultiFileListIterator::operator!=
                      ((MultiFileListIterator *)local_e8,&local_a8);
    if (!bVar1) break;
    __args = MultiFileListIterationHelper::MultiFileListIterator::operator*
                       ((MultiFileListIterator *)local_e8);
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_128,&__args->path);
    MultiFileListIterationHelper::MultiFileListIterator::operator++
              ((MultiFileListIterator *)local_e8);
  }
  if (local_a8.current_file.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.current_file.extended_info.internal.
               super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.current_file.path._M_dataplus._M_p != &local_a8.current_file.path.field_2) {
    operator_delete(local_a8.current_file.path._M_dataplus._M_p);
  }
  if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_pi);
  }
  if ((pointer *)local_d8._vptr_MultiFileList !=
      (pointer *)
      ((long)&local_d8.paths.
              super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
              super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
              _M_impl.super__Vector_impl_data + 8U)) {
    operator_delete(local_d8._vptr_MultiFileList);
  }
  local_e8._0_8_ = &local_d8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"file_path","");
  LogicalType::LogicalType((LogicalType *)&local_a8,VARCHAR);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_100,&local_128);
  Value::LIST(&local_68,(LogicalType *)&local_a8,&local_100);
  BindInfo::InsertOption(in_RDI,(string *)local_e8,&local_68);
  Value::~Value(&local_68);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_100);
  LogicalType::~LogicalType((LogicalType *)&local_a8);
  if ((MultiFileList *)local_e8._0_8_ != &local_d8) {
    operator_delete((void *)local_e8._0_8_);
  }
  bind_data_p_00 =
       unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>::
       operator*((unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
                  *)(local_108.ptr + 4));
  ParquetMultiFileInfo::GetBindInfo(bind_data_p_00,in_RDI);
  MultiFileOptions::AddBatchInfo((MultiFileOptions *)(local_108.ptr + 0x13),in_RDI);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_128);
  return in_RDI;
}

Assistant:

static BindInfo MultiFileGetBindInfo(const optional_ptr<FunctionData> bind_data_p) {
		BindInfo bind_info(ScanType::EXTERNAL);
		auto &bind_data = bind_data_p->Cast<MultiFileBindData>();

		vector<Value> file_path;
		for (const auto &file : bind_data.file_list->Files()) {
			file_path.emplace_back(file.path);
		}

		// LCOV_EXCL_START
		bind_info.InsertOption("file_path", Value::LIST(LogicalType::VARCHAR, file_path));
		OP::GetBindInfo(*bind_data.bind_data, bind_info);
		bind_data.file_options.AddBatchInfo(bind_info);
		// LCOV_EXCL_STOP
		return bind_info;
	}